

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_iostream.cpp
# Opt level: O0

void __thiscall stdio_stream_ops_wide_Test::TestBody(stdio_stream_ops_wide_Test *this)

{
  bool bVar1;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar2;
  wostream *stream;
  char *pcVar3;
  AssertHelper local_2b8;
  Message local_2b0;
  string local_2a8;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_1;
  Message local_270;
  string local_268;
  undefined1 local_248 [8];
  AssertionResult gtest_ar;
  string y;
  string x;
  undefined8 local_1f0;
  string local_1e8;
  string local_1b8;
  wstringstream local_198 [8];
  wstringstream sstream;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> local_188 [376];
  stdio_stream_ops_wide_Test *local_10;
  stdio_stream_ops_wide_Test *this_local;
  
  local_10 = this;
  std::__cxx11::wstringstream::wstringstream(local_198);
  ST::string::from_validated(&local_1b8,"xxxxx",5);
  pbVar2 = ::operator<<(local_188,&local_1b8);
  stream = std::operator<<((wostream *)pbVar2,L" ");
  ST::string::from_validated(&local_1e8,"yyyyy",5);
  ::operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)stream,&local_1e8);
  ST::string::~string(&local_1e8);
  ST::string::~string(&local_1b8);
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)(x.m_buffer.m_data + 8),0);
  std::wistream::seekg(local_198,x.m_buffer.m_data._8_8_,local_1f0);
  pcVar3 = y.m_buffer.m_data + 8;
  ST::string::string((string *)pcVar3);
  ST::string::string((string *)&gtest_ar.message_);
  operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)local_198,(string *)pcVar3);
  operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)local_198,
             (string *)&gtest_ar.message_);
  ST::string::from_validated(&local_268,"xxxxx",5);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_248,
             "ST::string::from_validated(\"\" \"xxxxx\" \"\", sizeof(\"xxxxx\") - 1)","x",&local_268
             ,(string *)(y.m_buffer.m_data + 8));
  ST::string::~string(&local_268);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_iostream.cpp"
               ,0x4a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  ST::string::from_validated(&local_2a8,"yyyyy",5);
  testing::internal::EqHelper::Compare<ST::string,_ST::string,_nullptr>
            ((EqHelper *)local_288,
             "ST::string::from_validated(\"\" \"yyyyy\" \"\", sizeof(\"yyyyy\") - 1)","y",&local_2a8
             ,(string *)&gtest_ar.message_);
  ST::string::~string(&local_2a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_iostream.cpp"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  ST::string::~string((string *)&gtest_ar.message_);
  ST::string::~string((string *)(y.m_buffer.m_data + 8));
  std::__cxx11::wstringstream::~wstringstream(local_198);
  return;
}

Assistant:

TEST(stdio, stream_ops_wide)
{
    std::wstringstream sstream;
    sstream << ST_LITERAL("xxxxx") << L" " << ST_LITERAL("yyyyy");

    sstream.seekg(0);
    ST::string x, y;
    sstream >> x;
    sstream >> y;

    EXPECT_EQ(ST_LITERAL("xxxxx"), x);
    EXPECT_EQ(ST_LITERAL("yyyyy"), y);
}